

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StartThreadP33xx(P33X *pP33x)

{
  int iVar1;
  long lVar2;
  CRITICAL_SECTION *pCriticalSection;
  THREAD_IDENTIFIER *pThreadId;
  
  pCriticalSection = P33xCS;
  pThreadId = P33xThreadId;
  lVar2 = 0;
  do {
    if (*(P33X **)((long)addrsP33x + lVar2 * 2) == pP33x) {
      *(undefined4 *)((long)resP33x + lVar2) = 1;
      *(undefined4 *)((long)bExitP33x + lVar2) = 0;
      InitCriticalSection(pCriticalSection);
      iVar1 = CreateDefaultThread(P33xThread,pP33x,pThreadId);
      return iVar1;
    }
    lVar2 = lVar2 + 4;
    pCriticalSection = pCriticalSection + 1;
    pThreadId = pThreadId + 1;
  } while (lVar2 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadP33xx(P33X* pP33x)
{
	int id = 0;

	while (addrsP33x[id] != pP33x)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resP33x[id] = EXIT_FAILURE;
	bExitP33x[id] = FALSE;
	InitCriticalSection(&P33xCS[id]);
	return CreateDefaultThread(P33xThread, (void*)pP33x, &P33xThreadId[id]);
}